

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_to_proto.c
# Opt level: O0

google_protobuf_ServiceDescriptorProto *
servicedef_toproto(upb_ToProto_Context *ctx,upb_ServiceDef *s)

{
  upb_ServiceDef *puVar1;
  _Bool _Var2;
  int iVar3;
  google_protobuf_ServiceDescriptorProto *msg;
  char *pcVar4;
  upb_MethodDef *m;
  google_protobuf_MethodDescriptorProto *pgVar5;
  google_protobuf_ServiceOptions *pgVar6;
  google_protobuf_ServiceOptions *dst;
  char *pb;
  size_t size;
  size_t i;
  google_protobuf_MethodDescriptorProto **methods;
  size_t n;
  google_protobuf_ServiceDescriptorProto *local_20;
  google_protobuf_ServiceDescriptorProto *proto;
  upb_ServiceDef *s_local;
  upb_ToProto_Context *ctx_local;
  
  proto = (google_protobuf_ServiceDescriptorProto *)s;
  s_local = (upb_ServiceDef *)ctx;
  msg = google_protobuf_ServiceDescriptorProto_new(ctx->arena);
  puVar1 = s_local;
  local_20 = msg;
  if (msg == (google_protobuf_ServiceDescriptorProto *)0x0) {
    siglongjmp((__jmp_buf_tag *)&s_local->resolved_features,1);
  }
  pcVar4 = upb_ServiceDef_Name((upb_ServiceDef *)proto);
  _n = strviewdup((upb_ToProto_Context *)puVar1,pcVar4);
  google_protobuf_ServiceDescriptorProto_set_name(msg,_n);
  iVar3 = upb_ServiceDef_MethodCount((upb_ServiceDef *)proto);
  methods = (google_protobuf_MethodDescriptorProto **)(long)iVar3;
  i = (size_t)google_protobuf_ServiceDescriptorProto_resize_method
                        (local_20,(size_t)methods,(upb_Arena *)s_local->opts);
  for (size = 0; puVar1 = s_local, size < methods; size = size + 1) {
    m = upb_ServiceDef_Method((upb_ServiceDef *)proto,(int)size);
    pgVar5 = methoddef_toproto((upb_ToProto_Context *)puVar1,m);
    *(google_protobuf_MethodDescriptorProto **)(i + size * 8) = pgVar5;
  }
  _Var2 = upb_ServiceDef_HasOptions((upb_ServiceDef *)proto);
  if (_Var2) {
    pgVar6 = upb_ServiceDef_Options((upb_ServiceDef *)proto);
    pcVar4 = google_protobuf_ServiceOptions_serialize
                       (pgVar6,(upb_Arena *)s_local->opts,(size_t *)&pb);
    if (pcVar4 == (char *)0x0) {
      siglongjmp((__jmp_buf_tag *)&s_local->resolved_features,1);
    }
    pgVar6 = google_protobuf_ServiceOptions_parse(pcVar4,(size_t)pb,(upb_Arena *)s_local->opts);
    if (pgVar6 == (google_protobuf_ServiceOptions *)0x0) {
      siglongjmp((__jmp_buf_tag *)&s_local->resolved_features,1);
    }
    google_protobuf_ServiceDescriptorProto_set_options(local_20,pgVar6);
  }
  return local_20;
}

Assistant:

static google_protobuf_ServiceDescriptorProto* servicedef_toproto(
    upb_ToProto_Context* ctx, const upb_ServiceDef* s) {
  google_protobuf_ServiceDescriptorProto* proto =
      google_protobuf_ServiceDescriptorProto_new(ctx->arena);
  CHK_OOM(proto);

  google_protobuf_ServiceDescriptorProto_set_name(
      proto, strviewdup(ctx, upb_ServiceDef_Name(s)));

  size_t n = upb_ServiceDef_MethodCount(s);
  google_protobuf_MethodDescriptorProto** methods =
      google_protobuf_ServiceDescriptorProto_resize_method(proto, n, ctx->arena);
  for (size_t i = 0; i < n; i++) {
    methods[i] = methoddef_toproto(ctx, upb_ServiceDef_Method(s, i));
  }

  if (upb_ServiceDef_HasOptions(s)) {
    SET_OPTIONS(proto, ServiceDescriptorProto, ServiceOptions,
                upb_ServiceDef_Options(s));
  }

  return proto;
}